

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O2

string * extractModelName(string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  uVar2 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x399ef1);
  if (uVar2 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  uVar2 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x3b518c);
  std::__cxx11::string::substr((ulong)&local_40,(ulong)__return_storage_ptr__);
  bVar1 = std::operator==(&local_40,"gz");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
    uVar2 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x3b518c);
  }
  if (uVar2 < __return_storage_ptr__->_M_string_length) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extractModelName(const std::string filename) {
  // Extract model name
  std::string name = filename;
  std::size_t found = name.find_last_of("/\\");
  if (found < name.size()) name = name.substr(found + 1);
  found = name.find_last_of(".");
  if (name.substr(found + 1) == "gz"
      //      || name.substr(found + 1) == "zip"
  ) {
    name.erase(found, name.size() - found);
    found = name.find_last_of(".");
  }
  if (found < name.size()) name.erase(found, name.size() - found);
  return name;
}